

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Station.cpp
# Opt level: O0

void __thiscall
imrt::Station::updateIntensity
          (Station *this,
          list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *diff)

{
  double dVar1;
  bool bVar2;
  size_type sVar3;
  double *pdVar4;
  pointer ppVar5;
  ostream *poVar6;
  Station *this_00;
  void *this_01;
  long in_RDI;
  double dVar7;
  int unaff_retaddr;
  int unaff_retaddr_00;
  Collimator *in_stack_00000008;
  iterator it;
  pair<int,_int> coord;
  ostream *in_stack_ffffffffffffff88;
  list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *in_stack_ffffffffffffff90;
  pair<int,_int> local_30;
  _Self local_28;
  _Self local_20;
  pair<int,_int> local_18 [3];
  
  std::pair<int,_int>::pair<int,_int,_true>(local_18);
  sVar3 = std::__cxx11::list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::size
                    (in_stack_ffffffffffffff90);
  if (sVar3 != 0) {
    local_20._M_node =
         (_List_node_base *)
         std::__cxx11::list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::begin
                   ((list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *)
                    in_stack_ffffffffffffff88);
    while( true ) {
      local_28._M_node =
           (_List_node_base *)
           std::__cxx11::list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::end
                     ((list<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *)
                      in_stack_ffffffffffffff88);
      bVar2 = std::operator!=(&local_20,&local_28);
      if (!bVar2) break;
      std::_List_iterator<std::pair<int,_double>_>::operator->
                ((_List_iterator<std::pair<int,_double>_> *)0x14f03d);
      local_30 = Collimator::indexToPos(in_stack_00000008,unaff_retaddr_00,unaff_retaddr);
      std::pair<int,_int>::operator=(local_18,&local_30);
      pdVar4 = maths::Matrix::operator()
                         ((Matrix *)(in_RDI + 0xb8),local_18[0].first,local_18[0].second);
      dVar7 = *pdVar4;
      ppVar5 = std::_List_iterator<std::pair<int,_double>_>::operator->
                         ((_List_iterator<std::pair<int,_double>_> *)0x14f095);
      dVar1 = ppVar5->second;
      pdVar4 = maths::Matrix::operator()
                         ((Matrix *)(in_RDI + 0xb8),local_18[0].first,local_18[0].second);
      *pdVar4 = dVar7 + dVar1;
      pdVar4 = maths::Matrix::operator()
                         ((Matrix *)(in_RDI + 0xb8),local_18[0].first,local_18[0].second);
      if (*pdVar4 <= 0.0 && *pdVar4 != 0.0) {
        poVar6 = std::operator<<((ostream *)&std::cout,
                                 "ERROR INTENSIDAD NEGATIVA EN updateIntensity!!!!");
        poVar6 = (ostream *)std::ostream::operator<<(poVar6,local_18[0].first);
        poVar6 = std::operator<<(poVar6,",");
        poVar6 = (ostream *)std::ostream::operator<<(poVar6,local_18[0].second);
        in_stack_ffffffffffffff88 = std::operator<<(poVar6,"-> ");
        ppVar5 = std::_List_iterator<std::pair<int,_double>_>::operator->
                           ((_List_iterator<std::pair<int,_double>_> *)0x14f146);
        poVar6 = (ostream *)std::ostream::operator<<(in_stack_ffffffffffffff88,ppVar5->second);
        this_00 = (Station *)std::operator<<(poVar6," is ");
        dVar7 = getApertureIntensity(this_00,(int)((ulong)in_stack_ffffffffffffff88 >> 0x20));
        poVar6 = (ostream *)std::ostream::operator<<(this_00,dVar7);
        poVar6 = std::operator<<(poVar6," ");
        pdVar4 = maths::Matrix::operator()
                           ((Matrix *)(in_RDI + 0xb8),local_18[0].first,local_18[0].second);
        this_01 = (void *)std::ostream::operator<<(poVar6,*pdVar4);
        std::ostream::operator<<(this_01,std::endl<char,std::char_traits<char>>);
        getchar();
      }
      std::_List_iterator<std::pair<int,_double>_>::operator++(&local_20,0);
    }
  }
  return;
}

Assistant:

void Station::updateIntensity(list<pair<int,double> > diff) {
    pair<int,int> coord;
    if (diff.size()<1){ 
      return; 
    }
    for (auto it=diff.begin(); it!=diff.end(); it++) {
      coord = collimator.indexToPos(it->first, angle);
      I(coord.first,coord.second) = I(coord.first,coord.second) + it->second;
      if (I(coord.first,coord.second) < 0) { 
        cout <<"ERROR INTENSIDAD NEGATIVA EN updateIntensity!!!!" << coord.first<<
          ","<<coord.second << "-> "<< it->second << " is " << 
            getApertureIntensity(0) << " " << I(coord.first,coord.second)<<endl;
        getchar();
      }
    }
  }